

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.hpp
# Opt level: O0

void __thiscall antlr::InputBuffer::syncConsume(InputBuffer *this)

{
  long in_RDI;
  size_t in_stack_00000028;
  CircularQueue<int> *in_stack_00000030;
  
  if (*(int *)(in_RDI + 0x10) != 0) {
    if (*(int *)(in_RDI + 8) == 0) {
      CircularQueue<int>::removeItems(in_stack_00000030,in_stack_00000028);
    }
    else {
      *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0x10) + *(int *)(in_RDI + 0xc);
    }
    *(undefined4 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

inline void InputBuffer::syncConsume() {
	if (numToConsume > 0)
	{
		if (nMarkers > 0)
			markerOffset += numToConsume;
		else
			queue.removeItems( numToConsume );
		numToConsume = 0;
	}
}